

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pinifile.c
# Opt level: O1

double p_ini_file_parameter_double(PIniFile *file,pchar *section,pchar *key,double default_val)

{
  pchar *str;
  undefined8 local_10;
  
  str = pp_ini_file_find_parameter(file,section,key);
  local_10 = default_val;
  if (str != (pchar *)0x0) {
    local_10 = p_strtod(str);
    p_free(str);
  }
  return local_10;
}

Assistant:

P_LIB_API double
p_ini_file_parameter_double (const PIniFile	*file,
			     const pchar	*section,
			     const pchar	*key,
			     double		default_val)
{
	pchar	*val;
	pdouble	ret;

	if ((val = pp_ini_file_find_parameter (file, section, key)) == NULL)
		return default_val;

	ret = p_strtod (val);
	p_free (val);

	return ret;
}